

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

void __thiscall llvm::Twine::Twine(Twine *this,NodeKind Kind)

{
  bool bVar1;
  NodeKind Kind_local;
  Twine *this_local;
  
  (this->LHS).twine = (Twine *)0x0;
  (this->RHS).twine = (Twine *)0x0;
  this->LHSKind = Kind;
  this->RHSKind = EmptyKind;
  bVar1 = isNullary(this);
  if (!bVar1) {
    __assert_fail("isNullary() && \"Invalid kind!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Twine.h"
                  ,0xaa,"llvm::Twine::Twine(NodeKind)");
  }
  return;
}

Assistant:

explicit Twine(NodeKind Kind) : LHSKind(Kind) {
      assert(isNullary() && "Invalid kind!");
    }